

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileMonitor.cxx
# Opt level: O2

string * __thiscall
cmDirectoryWatcher::Path_abi_cxx11_(string *__return_storage_ptr__,cmDirectoryWatcher *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  (*(((this->super_cmRealDirectoryWatcher).Parent)->super_cmIBaseWatcher)._vptr_cmIBaseWatcher[3])
            (&local_38);
  std::operator+(&bStack_58,&local_38,&(this->super_cmRealDirectoryWatcher).PathSegment);
  std::operator+(__return_storage_ptr__,&bStack_58,"/");
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string Path() const final
  {
    return this->Parent->Path() + this->PathSegment + "/";
  }